

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O2

int mg_session_read_run_message(mg_session *session,mg_message_run **message)

{
  int iVar1;
  mg_message_run *pmVar2;
  mg_map *extra;
  mg_string *statement;
  mg_map *parameters;
  
  iVar1 = mg_session_read_string(session,&statement);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mg_session_read_map(session,&parameters);
  if (iVar1 == 0) {
    extra = (mg_map *)0x0;
    if ((session->version != 4) || (iVar1 = mg_session_read_map(session,&extra), iVar1 == 0)) {
      pmVar2 = (mg_message_run *)mg_allocator_malloc(session->decoder_allocator,0x18);
      if (pmVar2 != (mg_message_run *)0x0) {
        pmVar2->statement = statement;
        pmVar2->parameters = parameters;
        pmVar2->extra = extra;
        *message = pmVar2;
        return 0;
      }
      mg_map_destroy_ca(extra,session->decoder_allocator);
      iVar1 = -3;
    }
    mg_map_destroy_ca(parameters,session->decoder_allocator);
  }
  else {
    mg_string_destroy_ca(statement,session->decoder_allocator);
  }
  mg_string_destroy_ca(statement,session->decoder_allocator);
  return iVar1;
}

Assistant:

int mg_session_read_run_message(mg_session *session, mg_message_run **message) {
  mg_string *statement;
  MG_RETURN_IF_FAILED(mg_session_read_string(session, &statement));

  int status = 0;

  mg_map *parameters;
  status = mg_session_read_map(session, &parameters);
  if (status != 0) {
    mg_string_destroy_ca(statement, session->decoder_allocator);
    goto cleanup_statement;
  }

  mg_map *extra = NULL;
  if (session->version == 4) {
    status = mg_session_read_map(session, &extra);
    if (status != 0) {
      goto cleanup_parameters;
    }
  }

  mg_message_run *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message_run));
  if (!tmessage) {
    status = MG_ERROR_OOM;
    goto cleanup;
  }

  tmessage->statement = statement;
  tmessage->parameters = parameters;
  tmessage->extra = extra;

  *message = tmessage;
  return 0;

cleanup:
  mg_map_destroy_ca(extra, session->decoder_allocator);

cleanup_parameters:
  mg_map_destroy_ca(parameters, session->decoder_allocator);

cleanup_statement:
  mg_string_destroy_ca(statement, session->decoder_allocator);
  return status;
}